

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *this_00;
  pointer puVar3;
  Simplex_handle sh;
  pointer puVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  iterator iVar7;
  Simplex_key SVar8;
  __node_base_ptr p_Var9;
  _Base_ptr p_Var10;
  logic_error *this_01;
  Simplex_handle SVar11;
  ulong uVar12;
  Simplex_key *pSVar13;
  _Hash_node_base *p_Var14;
  int iVar15;
  __hash_code __code;
  ulong uVar16;
  __node_base_ptr p_Var17;
  pointer puVar18;
  Simplex_key idx_fil;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertices;
  pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
  cocycle;
  unsigned_long local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  Simplex_key *local_68;
  iterator iStack_60;
  unsigned_long *local_58;
  Simplex_key local_48;
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  
  if (0 < this->dim_max_) {
    (this->interval_length_policy).min_length_ = min_interval_length;
    local_70 = 0xffffffffffffffff;
    local_68 = (Simplex_key *)0x0;
    iStack_60._M_current = (Simplex_key *)0x0;
    local_58 = (unsigned_long *)0x0;
    this_00 = this->cpx_;
    if ((this_00->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this_00->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      cubical_complex::
      Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
      initialize_filtration(this_00);
    }
    puVar18 = (this_00->sorted_cells).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (this_00->sorted_cells).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar18 != puVar3) {
      do {
        sh = *puVar18;
        local_70 = local_70 + 1;
        cubical_complex::
        Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
        assign_key(this->cpx_,sh,local_70);
        SVar8 = cubical_complex::
                Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                ::key(this->cpx_,sh);
        (this->dsets_).parent[SVar8] = SVar8;
        (this->dsets_).rank[SVar8] = 0;
        if (sh == 0xffffffffffffffff) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_01,"Only real cells have a dimension");
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        puVar4 = (this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = (long)(this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
        iVar15 = 0;
        SVar11 = sh;
        if (1 < uVar16) {
          iVar15 = 0;
          do {
            uVar2 = puVar4[uVar16 - 1];
            uVar12 = SVar11 / uVar2;
            SVar11 = SVar11 % (ulong)uVar2;
            uVar16 = uVar16 - 1;
            iVar15 = iVar15 + ((uint)uVar12 & 1);
          } while (1 < uVar16);
        }
        iVar15 = ((uint)SVar11 & 1) + iVar15;
        if (iVar15 == 0) {
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,iStack_60,
                       &local_70);
          }
          else {
            *iStack_60._M_current = local_70;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        else if (iVar15 == 1) {
          update_cohomology_groups_edge(this,sh);
        }
        else {
          update_cohomology_groups(this,sh,iVar15);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar3);
    }
    iVar7._M_current = iStack_60._M_current;
    if (local_68 != iStack_60._M_current) {
      pSVar13 = local_68;
      do {
        p_Var14 = (_Hash_node_base *)*pSVar13;
        if ((_Hash_node_base *)
            (this->ds_parent_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)p_Var14] == p_Var14) {
          uVar16 = (this->zero_cocycles_)._M_h._M_bucket_count;
          uVar12 = (ulong)p_Var14 % uVar16;
          p_Var5 = (this->zero_cocycles_)._M_h._M_buckets[uVar12];
          p_Var9 = (__node_base_ptr)0x0;
          if ((p_Var5 != (__node_base_ptr)0x0) &&
             (p_Var9 = p_Var5, p_Var17 = p_Var5->_M_nxt, p_Var14 != p_Var5->_M_nxt[1]._M_nxt)) {
            while (p_Var6 = p_Var17->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
              p_Var9 = (__node_base_ptr)0x0;
              if (((ulong)p_Var6[1]._M_nxt % uVar16 != uVar12) ||
                 (p_Var9 = p_Var17, p_Var17 = p_Var6, p_Var14 == p_Var6[1]._M_nxt))
              goto LAB_00103eef;
            }
            p_Var9 = (__node_base_ptr)0x0;
          }
LAB_00103eef:
          if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
            local_48 = cubical_complex::
                       Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                       ::simplex(this->cpx_,(Simplex_key)p_Var14);
            local_78 = 0xffffffffffffffff;
            local_80 = CONCAT44(local_80._4_4_,(this->coeff_field_).Prime);
            std::
            vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
            ::emplace_back<unsigned_long,unsigned_long,int>
                      ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                        *)&this->persistent_pairs_,&local_48,&local_78,(int *)&local_80);
          }
        }
        pSVar13 = pSVar13 + 1;
      } while (pSVar13 != iVar7._M_current);
    }
    p_Var14 = (this->zero_cocycles_)._M_h._M_before_begin._M_nxt;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      do {
        local_48 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::simplex(this->cpx_,(Simplex_key)p_Var14[2]._M_nxt);
        local_78 = 0xffffffffffffffff;
        local_80 = CONCAT44(local_80._4_4_,(this->coeff_field_).Prime);
        std::
        vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
        ::emplace_back<unsigned_long,unsigned_long,int>
                  ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                    *)&this->persistent_pairs_,&local_48,&local_78,(int *)&local_80);
        p_Var14 = p_Var14->_M_nxt;
      } while (p_Var14 != (_Hash_node_base *)0x0);
    }
    p_Var10 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      do {
        local_38 = p_Var10[1]._M_left;
        local_48 = *(Simplex_key *)(p_Var10 + 1);
        p_Stack_40 = p_Var10[1]._M_parent;
        local_78 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::simplex(this->cpx_,local_48);
        local_80 = 0xffffffffffffffff;
        std::
        vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
        ::emplace_back<unsigned_long,unsigned_long,int&>
                  ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                    *)&this->persistent_pairs_,&local_78,&local_80,(int *)&local_38);
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
    }
    if (local_68 != (Simplex_key *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }